

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableElimination.cpp
# Opt level: O2

uint __thiscall
Inferences::ALASCA::
PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
::partitionSize(PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                *this,bool lhs)

{
  uint uVar1;
  IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:182:15),_false>_>
  local_28;
  
  local_28._iter._inn._iter._next = 0;
  local_28._iter._inn._iter._from = 0;
  local_28._iter._inn._iter._to =
       (uint)((ulong)((long)(this->_orig)._cursor - (long)(this->_orig)._stack) >> 6);
  local_28._iter._next.super_OptionBase<unsigned_int>._isSome = false;
  local_28._iter._func.this = this;
  local_28._iter._func.lhs = lhs;
  uVar1 = Lib::
          IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/VariableElimination.cpp:182:15),_false>_>
          ::count(&local_28);
  return uVar1;
}

Assistant:

auto partitionSize(bool lhs) 
  { return iterTraits(range(0, (unsigned)_orig.size()))
      .filter([this, lhs](auto i) { return _partition.unwrap()[i] == lhs; })
      .count(); }